

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.h
# Opt level: O1

void __thiscall
xtest::AssertFail::AssertFail(AssertFail *this,char *case_name,char *msg,char *file_path,uint line)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  size_t sVar4;
  stringstream ss;
  string local_1d8;
  undefined7 uStack_1d7;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__AssertFail_00105d58;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  (this->m_message)._M_string_length = 0;
  (this->m_message).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ASSERT]",8);
  local_1d8 = (string)0x22;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
  lVar3 = -1;
  do {
    lVar1 = lVar3 + 1;
    lVar3 = lVar3 + 1;
  } while (file_path[lVar1] != '\0');
  if (lVar3 == 0) {
LAB_00102ffb:
    file_path = file_path + lVar3;
  }
  else {
    do {
      if ((file_path[lVar3] == '/') || (file_path[lVar3] == '\\')) goto LAB_00102ffb;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  sVar4 = strlen(file_path + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,file_path + 1,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" line ",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," in \"",5);
  if (case_name == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar4 = strlen(case_name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,case_name,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": ",3);
  if (msg == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar4 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,msg,sVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_message,&local_1d8);
  if ((long *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
    operator_delete((long *)CONCAT71(uStack_1d7,local_1d8),local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

AssertFail(const char *case_name,const char *msg,const char *file_path,unsigned int line){
            std::stringstream ss;
            ss << "[ASSERT]"
               << '\"'
               #if XTEST_OUTPUT_FULL_PATH
               << file_path
               #else
               << getFileName(file_path)
               #endif
               << "\" line "
               << line
               << " in \""
               << case_name
               << "\": "
               << msg;
            m_message = ss.str();
        }